

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O2

void __thiscall
gl3cts::TextureSwizzle::SmokeTest::prepareAndTestProgram
          (SmokeTest *this,testCase *test_case,size_t output_format_index,GLint output_channel_size,
          size_t index_of_swizzled_channel,bool test_vertex_stage)

{
  GLenum target;
  size_t sVar1;
  GLuint GVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  TestError *this_00;
  GLint local_98;
  GLint GStack_94;
  GLint GStack_90;
  GLint GStack_8c;
  programInfo program;
  string local_70;
  string local_50;
  long lVar5;
  
  sVar1 = test_case->m_source_texture_target_index;
  local_98 = test_case->m_texture_swizzle_red;
  GStack_94 = test_case->m_texture_swizzle_green;
  GStack_90 = test_case->m_texture_swizzle_blue;
  GStack_8c = test_case->m_texture_swizzle_alpha;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  getFragmentShader_abi_cxx11_(&local_50,this,test_case,output_format_index,!test_vertex_stage);
  getVertexShader_abi_cxx11_(&local_70,this,test_case,test_vertex_stage);
  program.m_context = (this->super_TestCase).m_context;
  program.m_fragment_shader_id = 0;
  program.m_program_object_id = 0;
  program.m_vertex_shader_id = 0;
  Utils::programInfo::build(&program,local_50._M_dataplus._M_p,local_70._M_dataplus._M_p);
  GVar2 = program.m_program_object_id;
  (**(code **)(lVar5 + 0x1680))(program.m_program_object_id);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"UseProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xc23);
  iVar3 = (**(code **)(lVar5 + 0xb48))(GVar2,"sampler");
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"GetUniformLocation",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xc27);
  if (iVar3 != -1) {
    (**(code **)(lVar5 + 0x14f0))(iVar3,0);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Uniform1i",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0xc2f);
    target = *(GLenum *)(texture_targets + sVar1 * 0x30 + 0x28);
    draw(this,target,&local_98,false);
    captureAndVerify(this,test_case,output_format_index,output_channel_size,
                     index_of_swizzled_channel);
    draw(this,target,&local_98,true);
    captureAndVerify(this,test_case,output_format_index,output_channel_size,
                     index_of_swizzled_channel);
    Utils::programInfo::~programInfo(&program);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Uniform is not available",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
             ,0xc2b);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SmokeTest::prepareAndTestProgram(const testCase& test_case, size_t output_format_index,
									  glw::GLint output_channel_size, size_t index_of_swizzled_channel,
									  bool test_vertex_stage)
{
	const _texture_target& source_target = texture_targets[test_case.m_source_texture_target_index];
	const glw::GLint	   red			 = test_case.m_texture_swizzle_red;
	const glw::GLint	   green		 = test_case.m_texture_swizzle_green;
	const glw::GLint	   blue			 = test_case.m_texture_swizzle_blue;
	const glw::GLint	   alpha		 = test_case.m_texture_swizzle_alpha;
	const glw::GLint	   param[4]		 = { red, green, blue, alpha };

	/*  */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Prepare program */
	const std::string& fs = getFragmentShader(test_case, output_format_index, !test_vertex_stage);
	const std::string& vs = getVertexShader(test_case, test_vertex_stage);

	Utils::programInfo program(m_context);
	program.build(fs.c_str(), vs.c_str());

	gl.useProgram(program.m_program_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgram");

	/* Prepare sampler */
	glw::GLint location = gl.getUniformLocation(program.m_program_object_id, "sampler");
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetUniformLocation");

	if (-1 == location)
	{
		TCU_FAIL("Uniform is not available");
	}

	gl.uniform1i(location, 0 /* texture unit */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1i");

	draw(source_target.m_target, param, false);
	captureAndVerify(test_case, output_format_index, output_channel_size, index_of_swizzled_channel);

	draw(source_target.m_target, param, true);
	captureAndVerify(test_case, output_format_index, output_channel_size, index_of_swizzled_channel);
}